

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.cpp
# Opt level: O2

void __thiscall mjs::gc_heap::gc_heap(gc_heap *this,uint32_t capacity)

{
  void *s;
  runtime_error *this_00;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pointer_set::pointer_set(&this->pointers_);
  s = malloc((ulong)capacity << 3);
  allocation_context::allocation_context(&this->alloc_context_,s,capacity);
  this->owns_storage_ = true;
  (this->gc_state_).level = 0;
  (this->gc_state_).new_context = (allocation_context *)0x0;
  (this->gc_state_).pending_fixups.
  super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gc_state_).weak_fixups.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->gc_state_).pending_fixups.
  super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gc_state_).pending_fixups.
  super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->gc_state_).weak_fixups.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gc_state_).weak_fixups.super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->alloc_context_).storage_ != (slot *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_80,capacity);
  std::operator+(&local_60,"Could not allocate heap for ",&local_80);
  std::operator+(&local_40,&local_60," slots");
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

gc_heap::gc_heap(uint32_t capacity) : alloc_context_(std::malloc(capacity * sizeof(slot)), capacity), owns_storage_(true) {
    if (!alloc_context_.storage()) {
        throw std::runtime_error("Could not allocate heap for " + std::to_string(capacity) + " slots");
    }
}